

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitRethrow(PrintExpressionContents *this,Rethrow *curr)

{
  string_view str;
  
  str._M_str = "rethrow ";
  str._M_len = 8;
  printMedium(this->o,str);
  Name::print(&curr->target,this->o);
  return;
}

Assistant:

void visitRethrow(Rethrow* curr) {
    printMedium(o, "rethrow ");
    curr->target.print(o);
  }